

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void __thiscall IrSim::getFunctions(IrSim *this,vector<int,_std::allocator<int>_> *f)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *this_00;
  value_type_conflict *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int *i;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  _Self local_28;
  _Self local_20;
  vector<int,_std::allocator<int>_> *local_18;
  value_type_conflict *local_10;
  
  local_18 = in_RDI + 0xb;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = (vector<int,_std::allocator<int>_> *)
              std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x110bc0)
    ;
    std::vector<int,_std::allocator<int>_>::push_back
              (this_00,(value_type_conflict *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    std::_Rb_tree_const_iterator<int>::operator++((_Rb_tree_const_iterator<int> *)in_RDI);
  }
  std::vector<InterCode,_std::allocator<InterCode>_>::size
            ((vector<InterCode,_std::allocator<InterCode>_> *)
             &in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::push_back(in_RDI,local_10);
  return;
}

Assistant:

void IrSim::getFunctions(vector<int> &f) {
    for (auto &i : functions)
        f.push_back(i);
    f.push_back((int)irList.size());
}